

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O1

void free_cached_groups(void)

{
  int *piVar1;
  EC_GROUP **ppEVar2;
  
  if (R3410_2012_512_paramset[0].nid != 0) {
    ppEVar2 = &R3410_2012_512_paramset[0].group;
    do {
      EC_GROUP_free((EC_GROUP *)*ppEVar2);
      *ppEVar2 = (EC_GROUP *)0x0;
      piVar1 = (int *)(ppEVar2 + 1);
      ppEVar2 = ppEVar2 + 9;
    } while (*piVar1 != 0);
  }
  if (R3410_2001_paramset[0].nid != 0) {
    ppEVar2 = &R3410_2001_paramset[0].group;
    do {
      EC_GROUP_free((EC_GROUP *)*ppEVar2);
      *ppEVar2 = (EC_GROUP *)0x0;
      piVar1 = (int *)(ppEVar2 + 1);
      ppEVar2 = ppEVar2 + 9;
    } while (*piVar1 != 0);
  }
  return;
}

Assistant:

void free_cached_groups()
{
    R3410_ec_params *params;

    /* Search nid in 2012 paramset */
    params = R3410_2012_512_paramset;
    while (params->nid != NID_undef) {
	EC_GROUP_free(params->group);
	params->group = NULL;
        params++;
    }

    /* Search nid in 2001 paramset */
    params = R3410_2001_paramset;
    while (params->nid != NID_undef) {
	EC_GROUP_free(params->group);
	params->group = NULL;
        params++;
    }
}